

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O3

void ggml_compute_forward_elu(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  ggml_type gVar2;
  int iVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  void *pvVar15;
  char cVar16;
  ushort uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  char *pcVar22;
  long lVar23;
  int64_t nth_1;
  undefined8 uVar24;
  int64_t ir;
  long lVar25;
  int64_t nth;
  long lVar26;
  anon_union_4_2_947300a4 u;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 extraout_var [60];
  
  pgVar5 = dst->src[0];
  gVar1 = dst->type;
  gVar2 = pgVar5->type;
  if (gVar2 == GGML_TYPE_BF16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar16 = ggml_is_contiguous_1(pgVar5);
      if (((cVar16 != '\0') && (cVar16 = ggml_is_contiguous_1(dst), cVar16 != '\0')) &&
         (cVar16 = ggml_are_same_shape(pgVar5,dst), cVar16 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar5->nb[0] == 2) {
            lVar20 = pgVar5->ne[2];
            sVar6 = pgVar5->nb[1];
            lVar7 = pgVar5->ne[1];
            lVar8 = dst->ne[0];
            iVar3 = params->nth;
            sVar9 = pgVar5->nb[2];
            sVar10 = pgVar5->nb[3];
            sVar11 = dst->nb[1];
            sVar12 = dst->nb[2];
            sVar13 = dst->nb[3];
            iVar4 = params->ith;
            lVar18 = ggml_nrows(pgVar5);
            lVar19 = ((long)iVar3 + -1 + lVar18) / (long)iVar3;
            lVar25 = iVar4 * lVar19;
            lVar19 = lVar19 + lVar25;
            if (lVar18 <= lVar19) {
              lVar19 = lVar18;
            }
            if (lVar25 < lVar19) {
              lVar20 = lVar20 * lVar7;
              do {
                lVar18 = lVar25 / lVar20;
                lVar23 = lVar25 % lVar20;
                lVar21 = lVar23 / lVar7;
                lVar23 = lVar23 % lVar7;
                if (0 < lVar8) {
                  lVar26 = 0;
                  pvVar14 = dst->data;
                  pvVar15 = pgVar5->data;
                  do {
                    fVar27 = (float)((uint)*(ushort *)
                                            ((long)pvVar15 +
                                            lVar26 * 2 +
                                            lVar21 * sVar9 + lVar23 * sVar6 + lVar18 * sVar10) <<
                                    0x10);
                    if (fVar27 <= 0.0) {
                      fVar27 = expm1f(fVar27);
                    }
                    *(float *)((long)pvVar14 +
                              lVar26 * 4 + lVar21 * sVar12 + lVar23 * sVar11 + lVar18 * sVar13) =
                         fVar27;
                    lVar26 = lVar26 + 1;
                  } while (lVar8 != lVar26);
                }
                lVar25 = lVar25 + 1;
              } while (lVar25 != lVar19);
            }
            return;
          }
          goto LAB_0012b782;
        }
        goto LAB_0012b766;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_BF16) goto LAB_0012b75e;
      cVar16 = ggml_is_contiguous_1(pgVar5);
      if (((cVar16 != '\0') && (cVar16 = ggml_is_contiguous_1(dst), cVar16 != '\0')) &&
         (cVar16 = ggml_are_same_shape(pgVar5,dst), cVar16 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012b766;
        if (pgVar5->nb[0] == 2) {
          lVar20 = pgVar5->ne[2];
          sVar6 = pgVar5->nb[1];
          lVar7 = pgVar5->ne[1];
          lVar8 = dst->ne[0];
          iVar3 = params->nth;
          sVar9 = pgVar5->nb[2];
          sVar10 = pgVar5->nb[3];
          sVar11 = dst->nb[1];
          sVar12 = dst->nb[2];
          sVar13 = dst->nb[3];
          iVar4 = params->ith;
          lVar18 = ggml_nrows(pgVar5);
          lVar19 = ((long)iVar3 + -1 + lVar18) / (long)iVar3;
          lVar25 = iVar4 * lVar19;
          lVar19 = lVar19 + lVar25;
          if (lVar18 <= lVar19) {
            lVar19 = lVar18;
          }
          if (lVar19 <= lVar25) {
            return;
          }
          lVar20 = lVar20 * lVar7;
          do {
            lVar18 = lVar25 / lVar20;
            lVar23 = lVar25 % lVar20;
            lVar21 = lVar23 / lVar7;
            lVar23 = lVar23 % lVar7;
            if (0 < lVar8) {
              lVar26 = 0;
              pvVar14 = dst->data;
              pvVar15 = pgVar5->data;
              do {
                fVar27 = (float)((uint)*(ushort *)
                                        ((long)pvVar15 +
                                        lVar26 * 2 +
                                        lVar21 * sVar9 + lVar23 * sVar6 + lVar18 * sVar10) << 0x10);
                if (fVar27 <= 0.0) {
                  fVar27 = expm1f(fVar27);
                }
                if ((uint)ABS(fVar27) < 0x7f800001) {
                  uVar17 = (ushort)((int)fVar27 + 0x7fff + ((uint)fVar27 >> 0x10 & 1) >> 0x10);
                }
                else {
                  uVar17 = (ushort)((uint)fVar27 >> 0x10) | 0x40;
                }
                *(ushort *)
                 ((long)pvVar14 + lVar26 * 2 + lVar21 * sVar12 + lVar23 * sVar11 + lVar18 * sVar13)
                     = uVar17;
                lVar26 = lVar26 + 1;
              } while (lVar8 != lVar26);
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != lVar19);
          return;
        }
        goto LAB_0012b782;
      }
    }
  }
  else if (gVar2 == GGML_TYPE_F16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar16 = ggml_is_contiguous_1(pgVar5);
      if (((cVar16 != '\0') && (cVar16 = ggml_is_contiguous_1(dst), cVar16 != '\0')) &&
         (cVar16 = ggml_are_same_shape(pgVar5,dst), cVar16 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_0012b766;
        if (pgVar5->nb[0] == 2) {
          lVar20 = pgVar5->ne[2];
          sVar6 = pgVar5->nb[1];
          lVar7 = pgVar5->ne[1];
          lVar8 = dst->ne[0];
          iVar3 = params->nth;
          sVar9 = pgVar5->nb[2];
          sVar10 = pgVar5->nb[3];
          sVar11 = dst->nb[1];
          sVar12 = dst->nb[2];
          sVar13 = dst->nb[3];
          iVar4 = params->ith;
          lVar18 = ggml_nrows(pgVar5);
          lVar19 = ((long)iVar3 + -1 + lVar18) / (long)iVar3;
          lVar25 = iVar4 * lVar19;
          lVar19 = lVar19 + lVar25;
          if (lVar18 <= lVar19) {
            lVar19 = lVar18;
          }
          if (lVar19 <= lVar25) {
            return;
          }
          lVar20 = lVar20 * lVar7;
          do {
            lVar18 = lVar25 / lVar20;
            lVar23 = lVar25 % lVar20;
            lVar21 = lVar23 / lVar7;
            lVar23 = lVar23 % lVar7;
            if (0 < lVar8) {
              lVar26 = 0;
              pvVar14 = dst->data;
              pvVar15 = pgVar5->data;
              do {
                fVar27 = *(float *)(&ggml_table_f32_f16 +
                                   (ulong)*(ushort *)
                                           ((long)pvVar15 +
                                           lVar26 * 2 +
                                           lVar21 * sVar9 + lVar23 * sVar6 + lVar18 * sVar10) * 4);
                if (fVar27 <= 0.0) {
                  fVar27 = expm1f(fVar27);
                }
                *(float *)((long)pvVar14 +
                          lVar26 * 4 + lVar21 * sVar12 + lVar23 * sVar11 + lVar18 * sVar13) = fVar27
                ;
                lVar26 = lVar26 + 1;
              } while (lVar8 != lVar26);
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != lVar19);
          return;
        }
LAB_0012b782:
        pcVar22 = "nb00 == sizeof(src0_t)";
        uVar24 = 0x56;
        goto LAB_0012b79c;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_F16) goto LAB_0012b75e;
      cVar16 = ggml_is_contiguous_1(pgVar5);
      if (((cVar16 != '\0') && (cVar16 = ggml_is_contiguous_1(dst), cVar16 != '\0')) &&
         (cVar16 = ggml_are_same_shape(pgVar5,dst), cVar16 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012b766;
        if (pgVar5->nb[0] == 2) {
          lVar20 = pgVar5->ne[2];
          sVar6 = pgVar5->nb[1];
          lVar7 = pgVar5->ne[1];
          lVar8 = dst->ne[0];
          iVar3 = params->nth;
          sVar9 = pgVar5->nb[2];
          sVar10 = pgVar5->nb[3];
          iVar4 = params->ith;
          lVar18 = ggml_nrows(pgVar5);
          lVar19 = ((long)iVar3 + -1 + lVar18) / (long)iVar3;
          lVar25 = iVar4 * lVar19;
          lVar19 = lVar19 + lVar25;
          if (lVar18 <= lVar19) {
            lVar19 = lVar18;
          }
          if (lVar19 <= lVar25) {
            return;
          }
          lVar20 = lVar20 * lVar7;
          do {
            lVar18 = lVar25 % lVar20;
            if (0 < lVar8) {
              lVar21 = 0;
              pvVar14 = pgVar5->data;
              do {
                fVar27 = *(float *)(&ggml_table_f32_f16 +
                                   (ulong)*(ushort *)
                                           ((long)pvVar14 +
                                           lVar21 * 2 +
                                           (lVar18 / lVar7) * sVar9 +
                                           (lVar18 % lVar7) * sVar6 + (lVar25 / lVar20) * sVar10) *
                                   4);
                auVar28 = ZEXT416((uint)fVar27);
                if (fVar27 <= 0.0) {
                  auVar29._0_4_ = expm1f(fVar27);
                  auVar29._4_60_ = extraout_var;
                  auVar28 = auVar29._0_16_;
                }
                auVar28 = vcvtps2ph_f16c(auVar28,0);
                vpextrw_avx(auVar28,0);
                lVar21 = lVar21 + 1;
              } while (lVar8 != lVar21);
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != lVar19);
          return;
        }
        goto LAB_0012b782;
      }
    }
  }
  else {
    if ((gVar2 != GGML_TYPE_F32) || (gVar1 != GGML_TYPE_F32)) {
LAB_0012b75e:
      ggml_compute_forward_elu_cold_1();
LAB_0012b766:
      pcVar22 = "nb0 == sizeof(dst_t)";
      uVar24 = 0x55;
      goto LAB_0012b79c;
    }
    cVar16 = ggml_is_contiguous_1(pgVar5);
    if (((cVar16 != '\0') && (cVar16 = ggml_is_contiguous_1(dst), cVar16 != '\0')) &&
       (cVar16 = ggml_are_same_shape(pgVar5,dst), cVar16 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012b766;
      if (pgVar5->nb[0] == 4) {
        lVar20 = pgVar5->ne[2];
        sVar6 = pgVar5->nb[1];
        lVar7 = pgVar5->ne[1];
        lVar8 = dst->ne[0];
        iVar3 = params->nth;
        sVar9 = pgVar5->nb[2];
        sVar10 = pgVar5->nb[3];
        sVar11 = dst->nb[1];
        sVar12 = dst->nb[2];
        sVar13 = dst->nb[3];
        iVar4 = params->ith;
        lVar18 = ggml_nrows(pgVar5);
        lVar19 = ((long)iVar3 + -1 + lVar18) / (long)iVar3;
        lVar25 = iVar4 * lVar19;
        lVar19 = lVar19 + lVar25;
        if (lVar18 <= lVar19) {
          lVar19 = lVar18;
        }
        if (lVar19 <= lVar25) {
          return;
        }
        lVar20 = lVar20 * lVar7;
        do {
          lVar18 = lVar25 / lVar20;
          lVar23 = lVar25 % lVar20;
          lVar21 = lVar23 / lVar7;
          lVar23 = lVar23 % lVar7;
          if (0 < lVar8) {
            lVar26 = 0;
            pvVar14 = dst->data;
            pvVar15 = pgVar5->data;
            do {
              fVar27 = *(float *)((long)pvVar15 +
                                 lVar26 * 4 + lVar21 * sVar9 + lVar23 * sVar6 + lVar18 * sVar10);
              if (fVar27 <= 0.0) {
                fVar27 = expm1f(fVar27);
              }
              *(float *)((long)pvVar14 +
                        lVar26 * 4 + lVar21 * sVar12 + lVar23 * sVar11 + lVar18 * sVar13) = fVar27;
              lVar26 = lVar26 + 1;
            } while (lVar8 != lVar26);
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != lVar19);
        return;
      }
      goto LAB_0012b782;
    }
  }
  pcVar22 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar24 = 0x51;
LAB_0012b79c:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar24,"GGML_ASSERT(%s) failed",pcVar22);
}

Assistant:

void ggml_compute_forward_elu(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_elu>(params, dst);
}